

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sha512.c
# Opt level: O0

void sha512_final(sha512 *ctx,uint8_t *out)

{
  ulong uVar1;
  long lVar2;
  long in_RSI;
  long in_RDI;
  int i;
  size_t rest;
  uint8_t *in_stack_000002a8;
  uint64_t *in_stack_000002b0;
  undefined4 local_1c;
  
  uVar1 = *(ulong *)(in_RDI + 200);
  lVar2 = *(long *)(in_RDI + 200);
  *(long *)(in_RDI + 200) = lVar2 + 1;
  *(undefined1 *)(in_RDI + 0x48 + lVar2) = 0x80;
  if (0x70 < *(ulong *)(in_RDI + 200)) {
    while (*(ulong *)(in_RDI + 200) < 0x80) {
      lVar2 = *(long *)(in_RDI + 200);
      *(long *)(in_RDI + 200) = lVar2 + 1;
      *(undefined1 *)(in_RDI + 0x48 + lVar2) = 0;
    }
    compress(in_stack_000002b0,in_stack_000002a8);
    *(undefined8 *)(in_RDI + 200) = 0;
  }
  while (*(ulong *)(in_RDI + 200) < 0x70) {
    lVar2 = *(long *)(in_RDI + 200);
    *(long *)(in_RDI + 200) = lVar2 + 1;
    *(undefined1 *)(in_RDI + 0x48 + lVar2) = 0;
  }
  store_be64((uint8_t *)(in_RDI + 0xb8),*(ulong *)(in_RDI + 0x40) >> 0x36);
  store_be64((uint8_t *)(in_RDI + 0xc0),(*(long *)(in_RDI + 0x40) << 7 | uVar1) << 3);
  compress(in_stack_000002b0,in_stack_000002a8);
  for (local_1c = 0; local_1c < 8; local_1c = local_1c + 1) {
    store_be64((uint8_t *)(in_RSI + (local_1c << 3)),*(uint64_t *)(in_RDI + (long)local_1c * 8));
  }
  return;
}

Assistant:

void
sha512_final(struct sha512 *ctx, uint8_t out[SHA512_HASH_LENGTH])
{
	size_t rest;
	int i;

	rest = ctx->fill;
	
	/* append 1-bit to signal end of data */
	ctx->buffer[ctx->fill++] = 0x80;
	
	if (ctx->fill > SHA512_BLOCK_SIZE - 16) {
		while (ctx->fill < SHA512_BLOCK_SIZE)
			ctx->buffer[ctx->fill++] = 0;

		compress(ctx->state, ctx->buffer);
		ctx->fill = 0;
	}
	while (ctx->fill < SHA512_BLOCK_SIZE - 16)
		ctx->buffer[ctx->fill++] = 0;

	/* because rest < 128 our message length is
	 * L := 128*ctx->count + rest == (ctx->count<<7)|rest,
	 * now convert L to number of bits and write out as 128bit big-endian.
	 */
	store_be64(ctx->buffer+SHA512_BLOCK_SIZE-16,
			ctx->count >> 54);
	store_be64(ctx->buffer+SHA512_BLOCK_SIZE-8,
			((ctx->count << 7) | rest) << 3);
	
	compress(ctx->state, ctx->buffer);


	for (i = 0; i < 8; i++)
		store_be64(out + 8*i, ctx->state[i]);
}